

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O3

ZyanStatus ZyanVectorDestroy(ZyanVector *vector)

{
  ZyanAllocator_ *pZVar1;
  ZyanStatus ZVar2;
  ulong uVar3;
  
  if (vector == (ZyanVector *)0x0) {
    ZVar2 = 0x80100004;
  }
  else {
    if (vector->element_size == 0) {
      __assert_fail("vector->element_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/dependencies/zycore/src/Vector.c"
                    ,0xf3,"ZyanStatus ZyanVectorDestroy(ZyanVector *)");
    }
    if (vector->data == (void *)0x0) {
      __assert_fail("vector->data",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/dependencies/zycore/src/Vector.c"
                    ,0xf4,"ZyanStatus ZyanVectorDestroy(ZyanVector *)");
    }
    if ((vector->destructor != (ZyanMemberProcedure)0x0) && (vector->size != 0)) {
      uVar3 = 0;
      do {
        (*vector->destructor)((void *)(vector->element_size * uVar3 + (long)vector->data));
        uVar3 = uVar3 + 1;
      } while (uVar3 < vector->size);
    }
    pZVar1 = vector->allocator;
    if ((pZVar1 != (ZyanAllocator_ *)0x0) && (vector->capacity != 0)) {
      if (pZVar1->deallocate == (ZyanAllocatorDeallocate)0x0) {
        __assert_fail("vector->allocator->deallocate",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/dependencies/zycore/src/Vector.c"
                      ,0x100,"ZyanStatus ZyanVectorDestroy(ZyanVector *)");
      }
      ZVar2 = (*pZVar1->deallocate)(pZVar1,vector->data,vector->element_size,vector->capacity);
      if ((int)ZVar2 < 0) {
        return ZVar2;
      }
    }
    vector->data = (void *)0x0;
    ZVar2 = 0x100000;
  }
  return ZVar2;
}

Assistant:

ZyanStatus ZyanVectorDestroy(ZyanVector* vector)
{
    if (!vector)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZYAN_ASSERT(vector->element_size);
    ZYAN_ASSERT(vector->data);

    if (vector->destructor)
    {
        for (ZyanUSize i = 0; i < vector->size; ++i)
        {
            vector->destructor(ZYCORE_VECTOR_OFFSET(vector, i));
        }
    }

    if (vector->allocator && vector->capacity)
    {
        ZYAN_ASSERT(vector->allocator->deallocate);
        ZYAN_CHECK(vector->allocator->deallocate(vector->allocator, vector->data,
            vector->element_size, vector->capacity));
    }

    vector->data = ZYAN_NULL;
    return ZYAN_STATUS_SUCCESS;
}